

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O2

int FindDiffVars(int *pDiffVars,Cube *pC1,Cube *pC2)

{
  drow *pdVar1;
  drow *pdVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uchar *puVar14;
  ulong uVar15;
  
  DiffVarCounter = 0;
  uVar12 = 0;
  uVar15 = (ulong)(uint)g_CoverInfo.nWordsOut;
  if (g_CoverInfo.nWordsOut < 1) {
    uVar15 = uVar12;
  }
  uVar6 = 0;
  do {
    if (uVar15 == uVar6) goto LAB_002bb2bd;
    pdVar1 = pC1->pCubeDataOut + uVar6;
    pdVar2 = pC2->pCubeDataOut + uVar6;
    uVar6 = uVar6 + 1;
  } while (*pdVar1 == *pdVar2);
  *pDiffVars = -1;
  DiffVarCounter = 1;
  uVar12 = 1;
LAB_002bb2bd:
  lVar8 = 0;
  uVar15 = uVar12;
  do {
    if (g_CoverInfo.nWordsIn <= lVar8) {
      return (int)uVar15;
    }
    uVar7 = pC2->pCubeDataIn[lVar8] ^ pC1->pCubeDataIn[lVar8];
    uVar7 = uVar7 >> 1 | uVar7;
    uVar5 = uVar7 & 0x5555;
    bVar3 = BitCount[uVar5];
    if ((ulong)bVar3 != 0) {
      if (4 < bVar3) {
        return 5;
      }
      bVar4 = BitGroupNumbers[uVar5];
      uVar10 = (ulong)(int)uVar12;
      puVar14 = GroupLiterals[bVar4];
      lVar13 = 1;
      uVar6 = uVar10;
      for (lVar9 = 0; -lVar9 != (ulong)bVar3; lVar9 = lVar9 + -1) {
        if (bVar4 == 200) {
          __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                        ,0x157,"int FindDiffVars(int *, Cube *, Cube *)");
        }
        uVar6 = uVar6 + 1;
        DiffVarCounter = (int)uVar12 + (int)lVar13;
        pDiffVars[uVar10 + lVar13 + -1] = (uint)*puVar14 + (int)lVar8 * 0x10;
        puVar14 = puVar14 + 1;
        lVar13 = lVar13 + 1;
        uVar15 = uVar6 & 0xffffffff;
      }
      if (4 < (long)(uVar10 - lVar9)) {
        return 5;
      }
      uVar12 = (uVar12 & 0xffffffff) - lVar9;
    }
    uVar5 = uVar7 >> 0x10 & 0x5555;
    bVar3 = BitCount[uVar5];
    if ((ulong)bVar3 != 0) {
      if (4 < bVar3) {
        return 5;
      }
      bVar4 = BitGroupNumbers[uVar5];
      iVar11 = (int)uVar12;
      uVar12 = (long)iVar11;
      for (lVar13 = 1; lVar13 - (ulong)bVar3 != 1; lVar13 = lVar13 + 1) {
        if (bVar4 == 200) {
          __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                        ,0x168,"int FindDiffVars(int *, Cube *, Cube *)");
        }
        uVar15 = uVar12 + 1;
        DiffVarCounter = (int)uVar12 + 1;
        pDiffVars[(long)iVar11 + lVar13 + -1] =
             (uint)(byte)(&UNK_007059bf)[lVar13 + (ulong)bVar4 * 4] + ((int)lVar8 << 4 | 8U);
        uVar12 = uVar15;
      }
    }
    lVar8 = lVar8 + 1;
  } while ((int)uVar12 < 5);
  return 5;
}

Assistant:

int FindDiffVars( int * pDiffVars, Cube * pC1, Cube * pC2 )
// determine different variables in two cubes and 
// writes them into pDiffVars[]
// -1 is written into pDiffVars[0] if the cubes have different outputs
// returns the number of different variables (including the output)
{
    int i, v;
    DiffVarCounter = 0;
    // check whether the output parts of the cubes are different

    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
        if ( pC1->pCubeDataOut[i] != pC2->pCubeDataOut[i] )
        { // they are different
            pDiffVars[0] = -1;
            DiffVarCounter = 1;
            break;
        }

    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
    {

        Temp1 = pC1->pCubeDataIn[i] ^ pC2->pCubeDataIn[i];
        Temp2 = (Temp1|(Temp1>>1)) & DIFFERENT;

        // check the first part of this word
        Temp = Temp2 & 0xffff;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;

        // check the second part of this word
        Temp = Temp2 >> 16;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + 8 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;
    }
    return DiffVarCounter;
}